

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_info.cpp
# Opt level: O2

void __thiscall license::os::CpuInfo::CpuInfo(CpuInfo *this)

{
  int *piVar1;
  uint *puVar2;
  undefined8 *puVar3;
  uint uVar4;
  int iVar5;
  uint __max_leaf;
  bool bVar6;
  uint32_t brand [16];
  allocator local_79;
  undefined1 local_78 [12];
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  string local_38 [32];
  
  piVar1 = (int *)cpuid_basic_info(0);
  local_78._0_4_ = piVar1[1];
  local_78._4_4_ = piVar1[2];
  iVar5 = piVar1[3];
  bVar6 = *piVar1 == 0;
  if (bVar6) {
    local_78._0_4_ = 0;
  }
  this->_vptr_CpuInfo = (_func_int **)&PTR__CpuInfo_001c8598;
  if (bVar6) {
    iVar5 = 0;
  }
  if (bVar6) {
    local_78._4_4_ = 0;
  }
  stack0xffffffffffffff90 = CONCAT44(uStack_6c,iVar5);
  CPUVendorID::toString_abi_cxx11_(&this->m_vendor,(CPUVendorID *)local_78);
  (this->m_brand)._M_dataplus._M_p = (pointer)&(this->m_brand).field_2;
  (this->m_brand)._M_string_length = 0;
  (this->m_brand).field_2._M_local_buf[0] = '\0';
  piVar1 = (int *)cpuid_brand_part3_info(0x80000004);
  if (*piVar1 == 0) {
    std::__cxx11::string::assign((char *)&this->m_brand);
  }
  else {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    stack0xffffffffffffff90 = 0;
    puVar2 = (uint *)cpuid(0x80000000);
    uVar4 = *puVar2;
    if (0x80000001 < uVar4) {
      puVar3 = (undefined8 *)cpuid_brand_part1_info(0x80000002);
      local_78._0_8_ = *puVar3;
      stack0xffffffffffffff90 =
           CONCAT44(*(undefined4 *)(puVar3 + 1),*(undefined4 *)((long)puVar3 + 0xc));
      if (uVar4 != 0x80000002) {
        puVar3 = (undefined8 *)cpuid_brand_part2_info(0x80000003);
        local_68 = *puVar3;
        uStack_60 = CONCAT44(*(undefined4 *)(puVar3 + 1),*(undefined4 *)((long)puVar3 + 0xc));
        if (0x80000003 < uVar4) {
          uStack_50 = CONCAT44(piVar1[2],piVar1[3]);
          local_58 = *(undefined8 *)piVar1;
        }
      }
    }
    std::__cxx11::string::string(local_38,local_78,&local_79);
    std::__cxx11::string::operator=((string *)&this->m_brand,local_38);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

CpuInfo::CpuInfo() : m_vendor(get_cpu_vendor()), m_brand(get_cpu_brand()) {}